

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errorHandle.hpp
# Opt level: O2

void __thiscall blc::error::exception::~exception(exception *this)

{
  ~exception(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

~exception() {}